

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRetime.c
# Opt level: O1

int Gia_ManMarkAutonomous_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  
  pGVar3 = p->pObjs;
  if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = (int)((long)pObj - (long)pGVar3 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar1) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar1] == p->nTravIds) {
    return *(uint *)pObj >> 0x1e & 1;
  }
  p->pTravIds[iVar1] = p->nTravIds;
  uVar4 = *(ulong *)pObj;
  uVar2 = (uint)uVar4;
  if ((uVar2 >> 0x1e & 1) != 0) {
    __assert_fail("pObj->fMark0 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaRetime.c"
                  ,0x32,"int Gia_ManMarkAutonomous_rec(Gia_Man_t *, Gia_Obj_t *)");
  }
  if ((uVar2 & 0x9fffffff) == 0x9fffffff) {
    if (((~uVar4 & 0x1fffffff1fffffff) == 0) ||
       ((int)((uint)(uVar4 >> 0x20) & 0x1fffffff) < p->vCis->nSize - p->nRegs)) {
LAB_0070a340:
      *(ulong *)pObj = uVar4 | 0x40000000;
      return 1;
    }
  }
  else if ((~uVar4 & 0x1fffffff1fffffff) == 0) goto LAB_0070a340;
  uVar4 = uVar4 & 0x1fffffff;
  if (-1 < (int)uVar2 || uVar4 == 0x1fffffff) {
    if ((uVar2 & 0x9fffffff) == 0x9fffffff) {
      pGVar3 = Gia_ObjRoToRi(p,pObj);
      goto LAB_0070a369;
    }
    if (((int)uVar2 < 0) || ((int)uVar4 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaRetime.c"
                    ,0x39,"int Gia_ManMarkAutonomous_rec(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar1 = Gia_ManMarkAutonomous_rec(p,pObj + -uVar4);
    if (iVar1 != 0) {
      *(ulong *)pObj = *(ulong *)pObj | 0x40000000;
      return 1;
    }
    uVar4 = (ulong)((uint)(*(ulong *)pObj >> 0x20) & 0x1fffffff);
  }
  pGVar3 = pObj + -uVar4;
LAB_0070a369:
  iVar1 = Gia_ManMarkAutonomous_rec(p,pGVar3);
  *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | (ulong)(uint)(iVar1 << 0x1e);
  return iVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Marks objects reachables from Const0 and PIs/

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Gia_ManMarkAutonomous_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return pObj->fMark0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( pObj->fMark0 == 0 );
    if ( Gia_ObjIsPi(p, pObj) || Gia_ObjIsConst0(pObj) )
        return pObj->fMark0 = 1;
    if ( Gia_ObjIsCo(pObj) )
        return pObj->fMark0 = Gia_ManMarkAutonomous_rec( p, Gia_ObjFanin0(pObj) );
    if ( Gia_ObjIsCi(pObj) )
        return pObj->fMark0 = Gia_ManMarkAutonomous_rec( p, Gia_ObjRoToRi(p, pObj) );
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ManMarkAutonomous_rec( p, Gia_ObjFanin0(pObj) ) )
        return pObj->fMark0 = 1;
    return pObj->fMark0 = Gia_ManMarkAutonomous_rec( p, Gia_ObjFanin1(pObj) );
}